

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O2

REF_INT ref_histogram_to_bin(REF_HISTOGRAM ref_histogram,REF_DBL observation)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  
  dVar1 = ref_histogram->exp;
  dVar5 = log2(observation);
  iVar2 = ref_histogram->nbin;
  iVar3 = (int)((double)(iVar2 / 2) + dVar5 * dVar1);
  iVar4 = 0;
  if (0 < iVar3) {
    iVar4 = iVar3;
  }
  iVar3 = iVar2 + -1;
  if (iVar4 < iVar2) {
    iVar3 = iVar4;
  }
  return iVar3;
}

Assistant:

REF_INT ref_histogram_to_bin(REF_HISTOGRAM ref_histogram, REF_DBL observation) {
  REF_DBL dbin;
  REF_INT ibin;
  dbin = ref_histogram_exp(ref_histogram) * log2((observation));
  dbin += ref_histogram_nbin(ref_histogram) / 2;
  ibin = (REF_INT)dbin;
  ibin = MAX(0, ibin);
  ibin = MIN(ref_histogram_nbin(ref_histogram) - 1, ibin);
  return ibin;
}